

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_vasprintf(char **strp,char *format,__va_list_tag *ap)

{
  char *pcVar1;
  undefined1 auStack_48 [8];
  va_list apc;
  int count;
  __va_list_tag *ap_local;
  char *format_local;
  char **strp_local;
  
  if (strp == (char **)0x0) {
    __assert_fail("strp",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1b3,"int cargo_vasprintf(char **, const char *, struct __va_list_tag *)");
  }
  apc[0].overflow_arg_area = ap->reg_save_area;
  auStack_48._0_4_ = ap->gp_offset;
  auStack_48._4_4_ = ap->fp_offset;
  apc[0]._0_8_ = ap->overflow_arg_area;
  apc[0].reg_save_area._4_4_ = _vscprintf(format,(__va_list_tag *)auStack_48);
  if (apc[0].reg_save_area._4_4_ == 0) {
    pcVar1 = _cargo_strdup("");
    *strp = pcVar1;
    strp_local._4_4_ = 0;
  }
  else {
    strp_local._4_4_ = apc[0].reg_save_area._4_4_;
    if (-1 < apc[0].reg_save_area._4_4_) {
      pcVar1 = (char *)_cargo_malloc((long)(apc[0].reg_save_area._4_4_ + 1));
      *strp = pcVar1;
      if (pcVar1 == (char *)0x0) {
        strp_local._4_4_ = -1;
      }
      else {
        strp_local._4_4_ = vsprintf(*strp,format,ap);
      }
    }
  }
  return strp_local._4_4_;
}

Assistant:

int cargo_vasprintf(char **strp, const char *format, va_list ap)
{
    int count;
    va_list apc;
    assert(strp);

    // Find out how long the resulting string is
    va_copy(apc, ap);
    count = _vscprintf(format, apc);
    va_end(apc);

    if (count == 0)
    {
        *strp = _cargo_strdup("");
        return 0;
    }
    else if (count < 0)
    {
        // Something went wrong, so return the error code (probably still requires checking of "errno" though)
        return count;
    }

    // Allocate memory for our string
    if (!(*strp = _cargo_malloc(count + 1)))
    {
        return -1;
    }

    // Do the actual printing into our newly created string
    return vsprintf(*strp, format, ap);
}